

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LossLayer::SerializeWithCachedSizes
          (LossLayer *this,CodedOutputStream *output)

{
  bool bVar1;
  int size;
  long lVar2;
  char *data;
  string *value;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  LossLayer *this_local;
  
  name_abi_cxx11_(this);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    name_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,"CoreML.Specification.LossLayer.name");
    value = name_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,value,output);
  }
  bVar1 = has_categoricalcrossentropylosslayer(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&((this->LossLayerType_).categoricalcrossentropylosslayer_)->super_MessageLite,
               output);
  }
  bVar1 = has_meansquarederrorlosslayer(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xb,&((this->LossLayerType_).categoricalcrossentropylosslayer_)->super_MessageLite,
               output);
  }
  return;
}

Assistant:

void LossLayer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LossLayer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string name = 1;
  if (this->name().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.LossLayer.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // .CoreML.Specification.CategoricalCrossEntropyLossLayer categoricalCrossEntropyLossLayer = 10;
  if (has_categoricalcrossentropylosslayer()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *LossLayerType_.categoricalcrossentropylosslayer_, output);
  }

  // .CoreML.Specification.MeanSquaredErrorLossLayer meanSquaredErrorLossLayer = 11;
  if (has_meansquarederrorlosslayer()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      11, *LossLayerType_.meansquarederrorlosslayer_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LossLayer)
}